

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::ArrayBuilder<capnp::compiler::NodeTranslator::AuxNode>::dispose
          (ArrayBuilder<capnp::compiler::NodeTranslator::AuxNode> *this)

{
  AuxNode *pAVar1;
  RemoveConst<capnp::compiler::NodeTranslator::AuxNode> *pRVar2;
  AuxNode *pAVar3;
  
  pAVar1 = this->ptr;
  if (pAVar1 != (AuxNode *)0x0) {
    pRVar2 = this->pos;
    pAVar3 = this->endPtr;
    this->endPtr = (AuxNode *)0x0;
    this->ptr = (AuxNode *)0x0;
    this->pos = (RemoveConst<capnp::compiler::NodeTranslator::AuxNode> *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pAVar1,0x40,(long)pRVar2 - (long)pAVar1 >> 6,
               (long)pAVar3 - (long)pAVar1 >> 6,
               ArrayDisposer::Dispose_<capnp::compiler::NodeTranslator::AuxNode>::destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }